

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimedTest.cpp
# Opt level: O1

unique_ptr<const_oout::Result,_std::default_delete<const_oout::Result>_> __thiscall
oout::TimedTest::result(TimedTest *this)

{
  long lVar1;
  long lVar2;
  TimedResult *this_00;
  long in_RSI;
  shared_ptr<const_oout::Result> result;
  _Head_base<0UL,_const_oout::Result_*,_false> local_30;
  shared_ptr<const_oout::Result> local_28;
  
  lVar1 = std::chrono::_V2::system_clock::now();
  (**(code **)(**(long **)(in_RSI + 8) + 0x10))(&local_30);
  std::__shared_ptr<oout::Result_const,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<oout::Result_const,std::default_delete<oout::Result_const>,void>
            ((__shared_ptr<oout::Result_const,(__gnu_cxx::_Lock_policy)2> *)&local_28,
             (unique_ptr<const_oout::Result,_std::default_delete<const_oout::Result>_> *)&local_30);
  if (local_30._M_head_impl != (Result *)0x0) {
    (*(local_30._M_head_impl)->_vptr_Result[1])();
  }
  lVar2 = std::chrono::_V2::system_clock::now();
  local_30._M_head_impl = (Result *)(lVar2 - lVar1);
  this_00 = (TimedResult *)operator_new(0x20);
  TimedResult::TimedResult(this_00,&local_28,(nanoseconds *)&local_30);
  (this->super_Test)._vptr_Test = (_func_int **)this_00;
  if (local_28.super___shared_ptr<const_oout::Result,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_28.super___shared_ptr<const_oout::Result,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return (__uniq_ptr_data<const_oout::Result,_std::default_delete<const_oout::Result>,_true,_true>)
         (__uniq_ptr_data<const_oout::Result,_std::default_delete<const_oout::Result>,_true,_true>)
         this;
}

Assistant:

unique_ptr<const Result> TimedTest::result() const
{
	const auto begin = chrono::high_resolution_clock::now();
	const shared_ptr<const Result> result = test->result();
	const auto end = chrono::high_resolution_clock::now();
	return make_unique<const TimedResult>(result, end - begin);
}